

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_perf.c
# Opt level: O2

void init_atoms(void)

{
  if (CM_TRANS_TEST_SIZE != -1) {
    return;
  }
  CM_TRANS_TEST_SIZE = attr_atom_from_string("CM_TRANS_TEST_SIZE");
  CM_TRANS_TEST_NODE = attr_atom_from_string("CM_TRANS_TEST_NODE");
  CM_TRANS_TEST_VECS = attr_atom_from_string("CM_TRANS_TEST_VECS");
  CM_TRANS_TEST_VERBOSE = attr_atom_from_string("CM_TRANS_TEST_VERBOSE");
  CM_TRANS_TEST_REPEAT = attr_atom_from_string("CM_TRANS_TEST_REPEAT");
  CM_TRANS_TEST_REUSE_WRITE_BUFFER = attr_atom_from_string("CM_TRANS_TEST_REUSE_WRITE_BUFFER");
  CM_TRANS_TEST_DURATION = attr_atom_from_string("CM_TRANS_TEST_DURATION_SECS");
  attr_atom_from_string("CM_TRANS_MEGABITS_SEC");
  return;
}

Assistant:

static void
init_atoms()
{
    if (CM_TRANS_TEST_SIZE==-1) {
	CM_TRANS_TEST_SIZE = attr_atom_from_string("CM_TRANS_TEST_SIZE");
	CM_TRANS_TEST_NODE = attr_atom_from_string("CM_TRANS_TEST_NODE");
	CM_TRANS_TEST_VECS = attr_atom_from_string("CM_TRANS_TEST_VECS");
	CM_TRANS_TEST_VERBOSE = attr_atom_from_string("CM_TRANS_TEST_VERBOSE");
	CM_TRANS_TEST_REPEAT = attr_atom_from_string("CM_TRANS_TEST_REPEAT");
	CM_TRANS_TEST_REUSE_WRITE_BUFFER = attr_atom_from_string("CM_TRANS_TEST_REUSE_WRITE_BUFFER");
	CM_TRANS_TEST_DURATION = attr_atom_from_string("CM_TRANS_TEST_DURATION_SECS");
	CM_TRANS_MEGABITS_SEC = attr_atom_from_string("CM_TRANS_MEGABITS_SEC");
	(void)CM_TRANS_MEGABITS_SEC;
    }
}